

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::EliminateDeadMembersPass::FindLiveMembers(EliminateDeadMembersPass *this)

{
  Op OVar1;
  Module *pMVar2;
  Instruction *this_00;
  pointer puVar3;
  bool bVar4;
  uint32_t uVar5;
  Instruction **ppIVar6;
  pointer puVar7;
  
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    this_00 = *ppIVar6;
    if (this_00 ==
        (Instruction *)
        ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
      pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      puVar3 = *(pointer *)
                ((long)&(pMVar2->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
      for (puVar7 = *(pointer *)
                     &(pMVar2->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                      ._M_impl; puVar7 != puVar3; puVar7 = puVar7 + 1) {
        FindLiveMembers(this,(Function *)
                             (puVar7->_M_t).
                             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       );
      }
      return;
    }
    OVar1 = this_00->opcode_;
    if (OVar1 == OpTypePointer) {
      uVar5 = Instruction::GetSingleWordInOperand(this_00,0);
      if (uVar5 == 0x14e5) {
        uVar5 = Instruction::GetSingleWordInOperand(this_00,1);
        MarkTypeAsFullyUsed(this,uVar5);
      }
    }
    else if (OVar1 == OpVariable) {
      uVar5 = Instruction::GetSingleWordInOperand(this_00,0);
      if (((uVar5 | 2) == 3) || (bVar4 = Instruction::IsVulkanStorageBufferVariable(this_00), bVar4)
         ) {
        uVar5 = Instruction::type_id(this_00);
        MarkPointeeTypeAsFullUsed(this,uVar5);
      }
    }
    else if (OVar1 == OpSpecConstantOp) {
      uVar5 = Instruction::GetSingleWordInOperand(this_00,0);
      if (uVar5 == 0x51) {
        MarkMembersAsLiveForExtract(this,this_00);
      }
      else if ((uVar5 - 0x41 < 3) || (uVar5 == 0x46)) {
        __assert_fail("false && \"Not implemented yet.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x37,"void spvtools::opt::EliminateDeadMembersPass::FindLiveMembers()");
      }
    }
    ppIVar6 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void EliminateDeadMembersPass::FindLiveMembers() {
  // Until we have implemented the rewriting of OpSpecConsantOp instructions,
  // we have to mark them as fully used just to be safe.
  for (auto& inst : get_module()->types_values()) {
    if (inst.opcode() == spv::Op::OpSpecConstantOp) {
      switch (spv::Op(inst.GetSingleWordInOperand(kSpecConstOpOpcodeIdx))) {
        case spv::Op::OpCompositeExtract:
          MarkMembersAsLiveForExtract(&inst);
          break;
        case spv::Op::OpCompositeInsert:
          // Nothing specific to do.
          break;
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
        case spv::Op::OpPtrAccessChain:
        case spv::Op::OpInBoundsPtrAccessChain:
          assert(false && "Not implemented yet.");
          break;
        default:
          break;
      }
    } else if (inst.opcode() == spv::Op::OpVariable) {
      switch (spv::StorageClass(inst.GetSingleWordInOperand(0))) {
        case spv::StorageClass::Input:
        case spv::StorageClass::Output:
          MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
        default:
          // Ignore structured buffers as layout(offset) qualifiers cannot be
          // applied to structure fields
          if (inst.IsVulkanStorageBufferVariable())
            MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
      }
    } else if (inst.opcode() == spv::Op::OpTypePointer) {
      uint32_t storage_class = inst.GetSingleWordInOperand(0);
      if (storage_class == uint32_t(spv::StorageClass::PhysicalStorageBuffer)) {
        MarkTypeAsFullyUsed(inst.GetSingleWordInOperand(1));
      }
    }
  }

  for (const Function& func : *get_module()) {
    FindLiveMembers(func);
  }
}